

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_string<std::vector<char,std::allocator<char>>>
          (result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  reference pcVar2;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_00;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_01;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_02;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_03;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_04;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_05;
  location<std::vector<char,_std::allocator<char>_>_> *extraout_RDX_06;
  location<std::vector<char,_std::allocator<char>_>_> *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  bool bVar4;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c1;
  location<std::vector<char,_std::allocator<char>_>_> *local_1c0;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b8;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  undefined1 local_188 [63];
  allocator<char> local_149;
  string local_148;
  string local_128;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_e8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_e0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_d8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_d0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_c8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_c0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_b8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_b0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_a8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_a0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_98;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_90;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_88;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_80;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_78;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_70;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_68;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_50;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_40;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  location<std::vector<char,_std::allocator<char>_>_> *local_18;
  location<std::vector<char,_std::allocator<char>_>_> *loc_local;
  
  local_18 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
  loc_local = (location<std::vector<char,_std::allocator<char>_>_> *)__return_storage_ptr__;
  local_20._M_current =
       (char *)location<std::vector<char,_std::allocator<char>_>_>::iter
                         ((location<std::vector<char,_std::allocator<char>_>_> *)this);
  local_28._M_current = (char *)location<std::vector<char,_std::allocator<char>_>_>::end(local_18);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
  bVar4 = false;
  if (bVar1) {
    local_30._M_current =
         (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_30);
    bVar4 = *pcVar2 == '\"';
  }
  if (bVar4) {
    local_40._M_current =
         (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
    local_38 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator+(&local_40,1);
    local_48._M_current = (char *)location<std::vector<char,_std::allocator<char>_>_>::end(local_18)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_48);
    bVar4 = false;
    plVar3 = extraout_RDX;
    if (bVar1) {
      local_58._M_current =
           (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
      local_50 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator+(&local_58,1);
      pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_50);
      bVar4 = false;
      plVar3 = extraout_RDX_00;
      if (*pcVar2 == '\"') {
        local_68._M_current =
             (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
        local_60 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&local_68,2);
        local_70._M_current =
             (char *)location<std::vector<char,_std::allocator<char>_>_>::end(local_18);
        bVar1 = __gnu_cxx::operator!=(&local_60,&local_70);
        bVar4 = false;
        plVar3 = extraout_RDX_01;
        if (bVar1) {
          local_80._M_current =
               (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
          local_78 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                     operator+(&local_80,2);
          pcVar2 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&local_78);
          bVar4 = *pcVar2 == '\"';
          plVar3 = extraout_RDX_02;
        }
      }
    }
    if (bVar4) {
      parse_ml_basic_string<std::vector<char,std::allocator<char>>>
                (__return_storage_ptr__,(detail *)local_18,plVar3);
    }
    else {
      parse_basic_string<std::vector<char,std::allocator<char>>>
                (__return_storage_ptr__,(detail *)local_18,plVar3);
    }
  }
  else {
    local_88._M_current =
         (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
    local_90._M_current = (char *)location<std::vector<char,_std::allocator<char>_>_>::end(local_18)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_88,&local_90);
    bVar4 = false;
    if (bVar1) {
      local_98._M_current =
           (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
      pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_98);
      bVar4 = *pcVar2 == '\'';
    }
    if (bVar4) {
      local_a8._M_current =
           (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
      local_a0 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator+(&local_a8,1);
      local_b0._M_current =
           (char *)location<std::vector<char,_std::allocator<char>_>_>::end(local_18);
      bVar1 = __gnu_cxx::operator!=(&local_a0,&local_b0);
      bVar4 = false;
      plVar3 = extraout_RDX_03;
      if (bVar1) {
        local_c0._M_current =
             (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
        local_b8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&local_c0,1);
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&local_b8);
        bVar4 = false;
        plVar3 = extraout_RDX_04;
        if (*pcVar2 == '\'') {
          local_d0._M_current =
               (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
          local_c8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                     operator+(&local_d0,2);
          local_d8._M_current =
               (char *)location<std::vector<char,_std::allocator<char>_>_>::end(local_18);
          bVar1 = __gnu_cxx::operator!=(&local_c8,&local_d8);
          bVar4 = false;
          plVar3 = extraout_RDX_05;
          if (bVar1) {
            local_e8._M_current =
                 (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(local_18);
            local_e0 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator+(&local_e8,2);
            pcVar2 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                     operator*(&local_e0);
            bVar4 = *pcVar2 == '\'';
            plVar3 = extraout_RDX_06;
          }
        }
      }
      if (bVar4) {
        parse_ml_literal_string<std::vector<char,std::allocator<char>>>
                  (__return_storage_ptr__,(detail *)local_18,plVar3);
      }
      else {
        parse_literal_string<std::vector<char,std::allocator<char>>>
                  (__return_storage_ptr__,(detail *)local_18,plVar3);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"[error] toml::parse_string: ",&local_149);
      local_1b8 = &local_1b0;
      local_1c0 = local_18;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[31],_true>
                (local_1b8,&local_1c0,(char (*) [31])0x17e268);
      local_188._0_8_ = &local_1b0;
      local_188._8_8_ = 1;
      std::
      allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_1c1);
      __l._M_len = local_188._8_8_;
      __l._M_array = (iterator)local_188._0_8_;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_188 + 0x10),__l,&local_1c1);
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1e8);
      format_underline(&local_128,&local_148,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_188 + 0x10),&local_1e8);
      err<std::__cxx11::string>(&local_108,(toml *)&local_128,v);
      result<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_108);
      failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~failure(&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1e8);
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_188 + 0x10));
      std::
      allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator(&local_1c1);
      local_228 = (pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_188;
      do {
        local_228 = local_228 + -1;
        std::
        pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_228);
      } while (local_228 != &local_1b0);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<toml::string, region<Container>>, std::string>
parse_string(location<Container>& loc)
{
    if(loc.iter() != loc.end() && *(loc.iter()) == '"')
    {
        if(loc.iter() + 1 != loc.end() && *(loc.iter() + 1) == '"' &&
           loc.iter() + 2 != loc.end() && *(loc.iter() + 2) == '"')
        {
            return parse_ml_basic_string(loc);
        }
        else
        {
            return parse_basic_string(loc);
        }
    }
    else if(loc.iter() != loc.end() && *(loc.iter()) == '\'')
    {
        if(loc.iter() + 1 != loc.end() && *(loc.iter() + 1) == '\'' &&
           loc.iter() + 2 != loc.end() && *(loc.iter() + 2) == '\'')
        {
            return parse_ml_literal_string(loc);
        }
        else
        {
            return parse_literal_string(loc);
        }
    }
    return err(format_underline("[error] toml::parse_string: ",
                {{std::addressof(loc), "the next token is not a string"}}));
}